

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> __thiscall
duckdb::ColumnWriter::CreateWriterRecursive
          (ColumnWriter *this,ClientContext *context,ParquetWriter *writer,
          vector<duckdb_parquet::SchemaElement,_true> *parquet_schemas,ParquetColumnSchema *schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *path_in_schema)

{
  LogicalType *this_00;
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  ParquetColumnSchema *pPVar3;
  undefined8 uVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> _Var8;
  _Alloc_hider _Var9;
  size_type sVar10;
  bool bVar11;
  int iVar12;
  const_reference pvVar13;
  undefined8 *puVar14;
  const_reference pvVar15;
  ArrayColumnWriter *this_01;
  _func_int *p_Var16;
  _func_int **pp_Var17;
  InternalException *this_02;
  ParquetColumnSchema *pPVar18;
  string *this_03;
  size_type __n;
  bool can_have_nulls;
  unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> child_writer_1;
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
  child_writers;
  unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> child_writer;
  undefined1 local_149;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_148;
  ParquetColumnSchema *local_140;
  ParquetWriter *local_138;
  _Head_base<0UL,_duckdb::ColumnWriter_*,_false> local_130;
  string local_128;
  undefined1 local_108 [40];
  ClientContext *local_e0;
  vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
  local_d8;
  undefined1 local_b8 [56];
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [24];
  
  local_138 = writer;
  local_130._M_head_impl = this;
  local_e0 = context;
  pvVar13 = vector<duckdb_parquet::SchemaElement,_true>::operator[]
                      (parquet_schemas,schema->schema_index);
  local_149 = (code)(pvVar13->repetition_type == OPTIONAL);
  local_148 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path_in_schema;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)path_in_schema,&schema->name);
  LVar1 = (schema->type).id_;
  local_140 = schema;
  if ((LVar1 == UNION) || (LVar1 == STRUCT)) {
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::reserve(&local_d8,
              ((long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(schema->children).
                     super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     .
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7);
    pPVar18 = (schema->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              .
              super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (schema->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar18 != pPVar3) {
      do {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_48,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_148);
        CreateWriterRecursive
                  ((ColumnWriter *)local_108,local_e0,local_138,parquet_schemas,pPVar18,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)local_48);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                    *)&local_d8,
                   (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)local_108);
        if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
        }
        local_108._0_8_ = (_func_int **)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_48);
        pPVar18 = pPVar18 + 1;
      } while (pPVar18 != pPVar3);
    }
    puVar14 = (undefined8 *)operator_new(0x50);
    uVar4 = *(undefined8 *)local_148;
    pbVar5 = *(pointer *)(local_148 + 8);
    pbVar6 = *(pointer *)(local_148 + 0x10);
    *(pointer *)(local_148 + 0x10) = (pointer)0x0;
    *(undefined8 *)local_148 = 0;
    *(pointer *)(local_148 + 8) = (pointer)0x0;
    local_b8._0_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8._8_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8._16_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    *puVar14 = &PTR__ColumnWriter_024cd330;
    puVar14[1] = local_138;
    puVar14[2] = local_140;
    puVar14[3] = uVar4;
    puVar14[4] = pbVar5;
    puVar14[5] = pbVar6;
    local_108._16_8_ = (ParquetColumnSchema *)0x0;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (ParquetWriter *)0x0;
    *(code *)(puVar14 + 6) = local_149;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    *puVar14 = &PTR__StructColumnWriter_024d0908;
    puVar14[7] = local_b8._0_8_;
    puVar14[8] = local_b8._8_8_;
    puVar14[9] = local_b8._16_8_;
    local_b8._16_8_ = (ParquetColumnSchema *)0x0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (ParquetWriter *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)local_b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    (local_130._M_head_impl)->_vptr_ColumnWriter = puVar14;
LAB_01d04f10:
    _Var8._M_head_impl = local_130._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector(&local_d8);
    return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
           _Var8._M_head_impl;
  }
  if (LVar1 == ARRAY) {
LAB_01d04f44:
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"list","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    pPVar18 = local_140;
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    pvVar15 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar18->children,0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_b8 + 0x20),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148);
    CreateWriterRecursive
              ((ColumnWriter *)local_b8,local_e0,local_138,parquet_schemas,pvVar15,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)(local_b8 + 0x20));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b8 + 0x20));
    if (LVar1 == LIST) {
      this_01 = (ArrayColumnWriter *)operator_new(0x40);
      uVar4 = local_b8._0_8_;
      pbVar5 = *(pointer *)local_148;
      this_03 = &local_128;
      pbVar6 = *(pointer *)(local_148 + 8);
      pbVar7 = *(pointer *)(local_148 + 0x10);
      *(undefined8 *)(local_148 + 0x10) = 0;
      *(undefined8 *)local_148 = 0;
      *(undefined8 *)(local_148 + 8) = 0;
      local_b8._0_8_ = (pointer)0x0;
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      (this_01->super_ListColumnWriter).super_ColumnWriter._vptr_ColumnWriter =
           (_func_int **)&PTR__ColumnWriter_024cd330;
      (this_01->super_ListColumnWriter).super_ColumnWriter.writer = local_138;
      (this_01->super_ListColumnWriter).super_ColumnWriter.column_schema = local_140;
      (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar5;
      (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
      (this_01->super_ListColumnWriter).super_ColumnWriter.schema_path.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
      local_108._16_8_ = (ParquetColumnSchema *)0x0;
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (ParquetWriter *)0x0;
      (this_01->super_ListColumnWriter).super_ColumnWriter.can_have_nulls = (bool)local_149;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      (this_01->super_ListColumnWriter).super_ColumnWriter._vptr_ColumnWriter =
           (_func_int **)&PTR__ListColumnWriter_024d07b8;
      (this_01->super_ListColumnWriter).child_writer.
      super_unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
      super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>.
      super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl = (ColumnWriter *)uVar4;
    }
    else {
      this_01 = (ArrayColumnWriter *)operator_new(0x40);
      local_108._0_8_ = *(undefined8 *)local_148;
      local_108._8_8_ = *(undefined8 *)(local_148 + 8);
      local_108._16_8_ = *(undefined8 *)(local_148 + 0x10);
      *(undefined8 *)(local_148 + 0x10) = 0;
      *(undefined8 *)local_148 = 0;
      *(undefined8 *)(local_148 + 8) = 0;
      local_128._M_dataplus._M_p = (pointer)local_b8._0_8_;
      local_b8._0_8_ = (pointer)0x0;
      ArrayColumnWriter::ArrayColumnWriter
                (this_01,local_138,local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_108,
                 (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                  *)&local_128,(bool)local_149);
      if ((ColumnWriter *)local_128._M_dataplus._M_p != (ColumnWriter *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
      local_128._M_dataplus._M_p = (pointer)0x0;
      this_03 = (string *)local_108;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_03);
    _Var8._M_head_impl = local_130._M_head_impl;
    (local_130._M_head_impl)->_vptr_ColumnWriter = (_func_int **)this_01;
    if ((pointer)local_b8._0_8_ == (pointer)0x0) {
      return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
             local_130._M_head_impl;
    }
    (*(code *)((((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_> *)
                local_b8._0_8_)->_M_t).
               super___uniq_ptr_impl<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>
               .super__Head_base<0UL,_duckdb::ColumnWriter_*,_false>._M_head_impl)->writer)();
    return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>)
           _Var8._M_head_impl;
  }
  if (LVar1 == MAP) {
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"key_value","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    pPVar18 = local_140;
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::reserve(&local_d8,2);
    __n = 0;
    do {
      pvVar15 = vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar18->children,__n);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(local_60,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
      CreateWriterRecursive
                ((ColumnWriter *)local_108,local_e0,local_138,parquet_schemas,pvVar15,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_60);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_60);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,std::default_delete<duckdb::ColumnWriter>,true>>>
                  *)&local_d8,
                 (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                  *)local_108);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_108._0_8_ + 8))();
      }
      __n = __n + 1;
    } while (__n == 1);
    p_Var16 = (_func_int *)operator_new(0x50);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_128,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148);
    uVar4 = local_128.field_2._M_allocated_capacity;
    sVar10 = local_128._M_string_length;
    _Var9._M_p = local_128._M_dataplus._M_p;
    local_b8._0_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8._8_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8._16_8_ =
         local_d8.
         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    *(undefined ***)p_Var16 = &PTR__ColumnWriter_024cd330;
    *(ParquetWriter **)(p_Var16 + 8) = local_138;
    *(ParquetColumnSchema **)(p_Var16 + 0x10) = local_140;
    *(pointer *)(p_Var16 + 0x18) = _Var9._M_p;
    *(size_type *)(p_Var16 + 0x20) = sVar10;
    *(undefined8 *)(p_Var16 + 0x28) = uVar4;
    local_108._16_8_ = (ParquetColumnSchema *)0x0;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (ParquetWriter *)0x0;
    p_Var16[0x30] = local_149;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    *(undefined ***)p_Var16 = &PTR__StructColumnWriter_024d0908;
    *(undefined8 *)(p_Var16 + 0x38) = local_b8._0_8_;
    *(undefined8 *)(p_Var16 + 0x40) = local_b8._8_8_;
    *(undefined8 *)(p_Var16 + 0x48) = local_b8._16_8_;
    local_b8._16_8_ = (ParquetColumnSchema *)0x0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (ParquetWriter *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>_>_>
               *)local_b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    pp_Var17 = (_func_int **)operator_new(0x40);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_128,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148);
    uVar4 = local_128.field_2._M_allocated_capacity;
    sVar10 = local_128._M_string_length;
    _Var9._M_p = local_128._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    *pp_Var17 = (_func_int *)&PTR__ColumnWriter_024cd330;
    pp_Var17[1] = (_func_int *)local_138;
    pp_Var17[2] = (_func_int *)local_140;
    pp_Var17[3] = (_func_int *)_Var9._M_p;
    pp_Var17[4] = (_func_int *)sVar10;
    pp_Var17[5] = (_func_int *)uVar4;
    local_108._16_8_ = (ParquetColumnSchema *)0x0;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (ParquetWriter *)0x0;
    *(code *)(pp_Var17 + 6) = local_149;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    *pp_Var17 = (_func_int *)&PTR__ListColumnWriter_024d07b8;
    pp_Var17[7] = p_Var16;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_128);
    (local_130._M_head_impl)->_vptr_ColumnWriter = pp_Var17;
    goto LAB_01d04f10;
  }
  if (LVar1 == LIST) goto LAB_01d04f44;
  this_00 = &schema->type;
  if (LVar1 == BLOB) {
    LogicalType::GetAlias_abi_cxx11_((string *)local_108,this_00);
    iVar12 = ::std::__cxx11::string::compare((char *)local_108);
    if (iVar12 != 0) goto LAB_01d05354;
    bVar11 = GeoParquetFileMetadata::IsGeoParquetConversionEnabled(local_e0);
  }
  else {
LAB_01d05354:
    bVar11 = false;
  }
  if ((LVar1 == BLOB) && ((undefined1 *)local_108._0_8_ != local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  if (bVar11 != false) {
    make_uniq<duckdb::WKBColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&,std::__cxx11::string_const&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149,&schema->name);
    goto LAB_01d05821;
  }
  switch(this_00->id_) {
  case BOOLEAN:
    make_uniq<duckdb::BooleanColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case TINYINT:
    make_uniq<duckdb::StandardColumnWriter<signed_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case INTEGER:
  case DATE:
LAB_01d054c0:
    make_uniq<duckdb::StandardColumnWriter<int,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case BIGINT:
  case TIME:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
LAB_01d05488:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case TIMESTAMP_SEC:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case TIMESTAMP_NS:
    make_uniq<duckdb::StandardColumnWriter<long,long,duckdb::ParquetTimestampNSOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case DECIMAL:
    PVar2 = (local_140->type).physical_type_;
    if (PVar2 == INT64) goto LAB_01d05488;
    if (PVar2 == INT32) goto LAB_01d054c0;
    if (PVar2 != INT16) {
      make_uniq<duckdb::FixedDecimalColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
                ((duckdb *)&local_128,local_138,local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_148,(bool *)&local_149);
      break;
    }
  case SMALLINT:
    make_uniq<duckdb::StandardColumnWriter<short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case FLOAT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case DOUBLE:
    make_uniq<duckdb::StandardColumnWriter<duckdb::double_na_equal,double,duckdb::FloatingPointOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case CHAR:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_01d0546f_caseD_18:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Unsupported type \"%s\" in Parquet writer","");
    LogicalType::ToString_abi_cxx11_(&local_80,this_00);
    InternalException::InternalException<std::__cxx11::string>
              (this_02,&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case BLOB:
    make_uniq<duckdb::StandardColumnWriter<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case INTERVAL:
    make_uniq<duckdb::StandardColumnWriter<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case UTINYINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_char,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case USMALLINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_short,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case UINTEGER:
    make_uniq<duckdb::StandardColumnWriter<unsigned_int,unsigned_int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case UBIGINT:
    make_uniq<duckdb::StandardColumnWriter<unsigned_long,unsigned_long,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case TIME_TZ:
    make_uniq<duckdb::StandardColumnWriter<duckdb::dtime_tz_t,long,duckdb::ParquetTimeTZOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case UHUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::uhugeint_t,double,duckdb::ParquetUhugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case HUGEINT:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  case UUID:
    make_uniq<duckdb::StandardColumnWriter<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
    break;
  default:
    if (this_00->id_ != ENUM) goto switchD_01d0546f_caseD_18;
    make_uniq<duckdb::EnumColumnWriter,duckdb::ParquetWriter&,duckdb::ParquetColumnSchema_const&,duckdb::vector<std::__cxx11::string,true>,bool&>
              ((duckdb *)&local_128,local_138,local_140,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_148,(bool *)&local_149);
  }
LAB_01d05821:
  (local_130._M_head_impl)->_vptr_ColumnWriter = (_func_int **)local_128._M_dataplus._M_p;
  return (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnWriter_*,_std::default_delete<duckdb::ColumnWriter>_>)
         local_130._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriter>
ColumnWriter::CreateWriterRecursive(ClientContext &context, ParquetWriter &writer,
                                    const vector<duckdb_parquet::SchemaElement> &parquet_schemas,
                                    const ParquetColumnSchema &schema, vector<string> path_in_schema) {
	auto &type = schema.type;
	auto can_have_nulls = parquet_schemas[schema.schema_index].repetition_type == FieldRepetitionType::OPTIONAL;
	path_in_schema.push_back(schema.name);
	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		// construct the child writers recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(schema.children.size());
		for (auto &child_column : schema.children) {
			child_writers.push_back(
			    CreateWriterRecursive(context, writer, parquet_schemas, child_column, path_in_schema));
		}
		return make_uniq<StructColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writers),
		                                     can_have_nulls);
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		path_in_schema.push_back("list");
		auto child_writer = CreateWriterRecursive(context, writer, parquet_schemas, schema.children[0], path_in_schema);
		if (is_list) {
			return make_uniq<ListColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                   can_have_nulls);
		} else {
			return make_uniq<ArrayColumnWriter>(writer, schema, std::move(path_in_schema), std::move(child_writer),
			                                    can_have_nulls);
		}
	}
	if (type.id() == LogicalTypeId::MAP) {
		path_in_schema.push_back("key_value");
		// construct the child types recursively
		vector<unique_ptr<ColumnWriter>> child_writers;
		child_writers.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			auto child_writer =
			    CreateWriterRecursive(context, writer, parquet_schemas, schema.children[i], path_in_schema);
			child_writers.push_back(std::move(child_writer));
		}
		auto struct_writer =
		    make_uniq<StructColumnWriter>(writer, schema, path_in_schema, std::move(child_writers), can_have_nulls);
		return make_uniq<ListColumnWriter>(writer, schema, path_in_schema, std::move(struct_writer), can_have_nulls);
	}
	if (type.id() == LogicalTypeId::BLOB && type.GetAlias() == "WKB_BLOB" &&
	    GeoParquetFileMetadata::IsGeoParquetConversionEnabled(context)) {
		return make_uniq<WKBColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls, schema.name);
	}

	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<BooleanColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TINYINT:
		return make_uniq<StandardColumnWriter<int8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                        can_have_nulls);
	case LogicalTypeId::SMALLINT:
		return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
		return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::TIME_TZ:
		return make_uniq<StandardColumnWriter<dtime_tz_t, int64_t, ParquetTimeTZOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::HUGEINT:
		return make_uniq<StandardColumnWriter<hugeint_t, double, ParquetHugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UHUGEINT:
		return make_uniq<StandardColumnWriter<uhugeint_t, double, ParquetUhugeintOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampNSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::TIMESTAMP_SEC:
		return make_uniq<StandardColumnWriter<int64_t, int64_t, ParquetTimestampSOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UTINYINT:
		return make_uniq<StandardColumnWriter<uint8_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                         can_have_nulls);
	case LogicalTypeId::USMALLINT:
		return make_uniq<StandardColumnWriter<uint16_t, int32_t>>(writer, schema, std::move(path_in_schema),
		                                                          can_have_nulls);
	case LogicalTypeId::UINTEGER:
		return make_uniq<StandardColumnWriter<uint32_t, uint32_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::UBIGINT:
		return make_uniq<StandardColumnWriter<uint64_t, uint64_t>>(writer, schema, std::move(path_in_schema),
		                                                           can_have_nulls);
	case LogicalTypeId::FLOAT:
		return make_uniq<StandardColumnWriter<float_na_equal, float, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DOUBLE:
		return make_uniq<StandardColumnWriter<double_na_equal, double, FloatingPointOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return make_uniq<StandardColumnWriter<int16_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT32:
			return make_uniq<StandardColumnWriter<int32_t, int32_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		case PhysicalType::INT64:
			return make_uniq<StandardColumnWriter<int64_t, int64_t>>(writer, schema, std::move(path_in_schema),
			                                                         can_have_nulls);
		default:
			return make_uniq<FixedDecimalColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
		}
	case LogicalTypeId::BLOB:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetBlobOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::VARCHAR:
		return make_uniq<StandardColumnWriter<string_t, string_t, ParquetStringOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::UUID:
		return make_uniq<StandardColumnWriter<hugeint_t, ParquetUUIDTargetType, ParquetUUIDOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::INTERVAL:
		return make_uniq<StandardColumnWriter<interval_t, ParquetIntervalTargetType, ParquetIntervalOperator>>(
		    writer, schema, std::move(path_in_schema), can_have_nulls);
	case LogicalTypeId::ENUM:
		return make_uniq<EnumColumnWriter>(writer, schema, std::move(path_in_schema), can_have_nulls);
	default:
		throw InternalException("Unsupported type \"%s\" in Parquet writer", type.ToString());
	}
}